

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::PrintFieldDescriptor
          (Generator *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  float value;
  double value_00;
  byte bVar1;
  undefined1 uVar2;
  undefined1 uVar5;
  undefined2 uVar6;
  ushort *puVar3;
  char *pcVar4;
  Printer *this_00;
  undefined4 uVar7;
  FieldDescriptor **ppFVar8;
  Nonnull<char_*> pcVar9;
  size_t sVar10;
  EnumValueDescriptor *pEVar11;
  Nonnull<const_char_*> pcVar12;
  bool bVar13;
  char *pcVar14;
  io *this_01;
  undefined1 *this_02;
  AlphaNum *pAVar15;
  char *pcVar16;
  string_view serialized_options;
  string_view text;
  string_view src;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  string options_string;
  char field_descriptor_decl [455];
  AlphaNum local_2e8;
  string local_2b8;
  string local_298;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_278;
  AlphaNum local_250;
  string local_220;
  Generator *local_200;
  anon_union_8_1_a8a14541_for_iterator_2 local_1f8;
  anon_union_8_1_a8a14541_for_iterator_2 local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8 [27];
  
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  local_220._M_string_length = 0;
  local_220.field_2._M_local_buf[0] = '\0';
  this_02 = (undefined1 *)(proto->field_0)._impl_.options_;
  if ((FieldOptions *)this_02 == (FieldOptions *)0x0) {
    this_02 = _FieldOptions_default_instance_;
  }
  local_200 = this;
  MessageLite::SerializeToString((MessageLite *)this_02,&local_220);
  local_278.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_278.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_278.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  puVar3 = (ushort *)(field->all_names_).payload_;
  local_1f8.slot_ = (slot_type *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,(long)puVar3 + ~(ulong)*puVar3,(long)puVar3 + -1);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_2e8,&local_278,(char (*) [5])0x6fff3e);
  std::__cxx11::string::operator=
            ((string *)((long)local_2e8.piece_._M_str + 0x10),(string *)&local_1f8);
  if (local_1f8.slot_ != (slot_type *)local_1e8) {
    operator_delete(local_1f8.slot_,local_1e8[0]._M_allocated_capacity + 1);
  }
  pcVar4 = (field->all_names_).payload_;
  local_1f8.slot_ = (slot_type *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,pcVar4 + ~(ulong)*(ushort *)(pcVar4 + 2),pcVar4 + -1);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[10]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_2e8,&local_278,(char (*) [10])0x688d99);
  std::__cxx11::string::operator=
            ((string *)((long)local_2e8.piece_._M_str + 0x10),(string *)&local_1f8);
  if (local_1f8.slot_ != (slot_type *)local_1e8) {
    operator_delete(local_1f8.slot_,local_1e8[0]._M_allocated_capacity + 1);
  }
  if ((field->field_0x1 & 8) == 0) {
    ppFVar8 = &field->containing_type_->fields_;
  }
  else if ((field->scope_).extension_scope == (Descriptor *)0x0) {
    ppFVar8 = &field->file_->extensions_;
  }
  else {
    ppFVar8 = &((field->scope_).extension_scope)->extensions_;
  }
  pcVar9 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     ((int)((ulong)((long)field - (long)*ppFVar8) >> 3) * -0x45d1745d,
                      (Nonnull<char_*>)local_1e8);
  local_1f8.slot_ = (slot_type *)(pcVar9 + -(long)local_1e8);
  pcVar4 = local_2e8.digits_;
  local_2e8.piece_._M_len = (size_t)pcVar4;
  local_1f0.slot_ = (slot_type *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,(slot_type *)local_1e8,pcVar9);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[6]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_250,&local_278,(char (*) [6])0x51e287);
  std::__cxx11::string::operator=((string *)(local_250.piece_._M_str + 0x10),(string *)&local_2e8);
  if ((char *)local_2e8.piece_._M_len != pcVar4) {
    operator_delete((void *)local_2e8.piece_._M_len,local_2e8.digits_._0_8_ + 1);
  }
  pcVar9 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     (field->number_,(Nonnull<char_*>)local_1e8);
  local_1f8.slot_ = (slot_type *)(pcVar9 + -(long)local_1e8);
  local_2e8.piece_._M_len = (size_t)pcVar4;
  local_1f0.slot_ = (slot_type *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,(slot_type *)local_1e8,pcVar9);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[7]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_250,&local_278,(char (*) [7])0x6ca8c3);
  std::__cxx11::string::operator=((string *)(local_250.piece_._M_str + 0x10),(string *)&local_2e8);
  if ((char *)local_2e8.piece_._M_len != pcVar4) {
    operator_delete((void *)local_2e8.piece_._M_len,local_2e8.digits_._0_8_ + 1);
  }
  pcVar9 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     ((uint)field->type_,(Nonnull<char_*>)local_1e8);
  local_1f8.slot_ = (slot_type *)(pcVar9 + -(long)local_1e8);
  local_2e8.piece_._M_len = (size_t)pcVar4;
  local_1f0.slot_ = (slot_type *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,(slot_type *)local_1e8,pcVar9);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_250,&local_278,(char (*) [5])0x6c7d9a);
  std::__cxx11::string::operator=((string *)(local_250.piece_._M_str + 0x10),(string *)&local_2e8);
  if ((char *)local_2e8.piece_._M_len != pcVar4) {
    operator_delete((void *)local_2e8.piece_._M_len,local_2e8.digits_._0_8_ + 1);
  }
  pcVar9 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     (*(int32_t *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4),
                      (Nonnull<char_*>)local_1e8);
  local_1f8.slot_ = (slot_type *)(pcVar9 + -(long)local_1e8);
  local_2e8.piece_._M_len = (size_t)pcVar4;
  local_1f0.slot_ = (slot_type *)local_1e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,(slot_type *)local_1e8,pcVar9);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[9]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_250,&local_278,(char (*) [9])"cpp_type");
  std::__cxx11::string::operator=((string *)(local_250.piece_._M_str + 0x10),(string *)&local_2e8);
  if ((char *)local_2e8.piece_._M_len != pcVar4) {
    operator_delete((void *)local_2e8.piece_._M_len,local_2e8.digits_._0_8_ + 1);
  }
  bVar1 = field->field_0x1;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[18]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_1f8,&local_278,(char (*) [18])"has_default_value");
  pcVar16 = "False";
  pcVar14 = "False";
  if ((bVar1 & 1) != 0) {
    pcVar14 = "True";
  }
  pAVar15 = (AlphaNum *)((ulong)(bVar1 & 1) ^ 5);
  this_01 = (io *)0x0;
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_1f0.slot_ + 0x10),0,*(char **)((long)local_1f0.slot_ + 0x18),
             (ulong)pcVar14);
  bVar1 = field->field_0x1;
  bVar13 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 != bVar13) {
    pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        (bVar13,0xbf < bVar1,
                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xb54,pcVar12);
    goto LAB_001f34c6;
  }
  if ((bVar1 & 0x20) != 0) {
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_2b8.field_2._M_allocated_capacity._0_2_ = 0x5d5b;
    local_2b8._M_string_length = 2;
    local_2b8.field_2._M_local_buf[2] = '\0';
    goto LAB_001f2ce2;
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    pcVar9 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((field->field_20).default_value_int32_t_,(Nonnull<char_*>)local_1e8);
    local_1f8.slot_ = (slot_type *)(pcVar9 + -(long)local_1e8);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_1f0.slot_ = (slot_type *)local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,(slot_type *)local_1e8,pcVar9);
    break;
  case 2:
    pcVar9 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((field->field_20).default_value_int64_t_,(Nonnull<char_*>)local_1e8);
    local_1f8.slot_ = (slot_type *)(pcVar9 + -(long)local_1e8);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_1f0.slot_ = (slot_type *)local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,(slot_type *)local_1e8,pcVar9);
    break;
  case 3:
    pcVar9 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((field->field_20).default_value_uint32_t_,(Nonnull<char_*>)local_1e8);
    local_1f8.slot_ = (slot_type *)(pcVar9 + -(long)local_1e8);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_1f0.slot_ = (slot_type *)local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,(slot_type *)local_1e8,pcVar9);
    break;
  case 4:
    pcVar9 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((field->field_20).default_value_uint64_t_,(Nonnull<char_*>)local_1e8);
    local_1f8.slot_ = (slot_type *)(pcVar9 + -(long)local_1e8);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_1f0.slot_ = (slot_type *)local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,(slot_type *)local_1e8,pcVar9);
    break;
  case 5:
    value_00 = (field->field_20).default_value_double_;
    if (INFINITY <= value_00) {
LAB_001f32b0:
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      local_2b8.field_2._M_allocated_capacity._0_2_ = 0x6531;
      local_2b8.field_2._M_local_buf[2] = '1';
      local_2b8.field_2._M_local_buf[3] = '0';
      local_2b8.field_2._M_local_buf[4] = '0';
      local_2b8.field_2._M_allocated_capacity._5_2_ = 0x3030;
      local_2b8._M_string_length = 7;
      local_2b8.field_2._M_local_buf[7] = '\0';
    }
    else if (value_00 <= -INFINITY) {
LAB_001f33c4:
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      local_2b8.field_2._M_allocated_capacity._0_2_ = 0x312d;
      local_2b8.field_2._M_local_buf[2] = 'e';
      local_2b8.field_2._M_local_buf[3] = '1';
      local_2b8.field_2._M_local_buf[4] = '0';
      local_2b8.field_2._M_allocated_capacity._5_2_ = 0x3030;
      local_2b8.field_2._M_local_buf[7] = '0';
      local_2b8._M_string_length = 8;
      local_2b8.field_2._M_local_buf[8] = '\0';
    }
    else {
      if (!NAN(value_00)) {
        local_1f8.slot_ = (slot_type *)&DAT_00000006;
        local_1f0.slot_ = (slot_type *)0x54d2b8;
        io::SimpleDtoa_abi_cxx11_(&local_298,this_01,value_00);
        local_2e8.piece_._M_len = local_298._M_string_length;
        local_2e8.piece_._M_str = local_298._M_dataplus._M_p;
        local_250.piece_._M_len = 1;
        local_250.piece_._M_str = ")";
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_2b8,(lts_20250127 *)&local_1f8,&local_2e8,&local_250,pAVar15);
        goto LAB_001f3393;
      }
LAB_001f3502:
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      local_2b8.field_2._M_allocated_capacity._0_2_ = 0x3128;
      local_2b8.field_2._M_local_buf[2] = 'e';
      local_2b8.field_2._M_local_buf[3] = '1';
      local_2b8.field_2._M_local_buf[4] = '0';
      local_2b8.field_2._M_allocated_capacity._5_2_ = 0x3030;
      local_2b8.field_2._M_local_buf[7] = '0';
      local_2b8.field_2._M_local_buf[8] = ' ';
      local_2b8.field_2._9_4_ = 0x2930202a;
      local_2b8._M_string_length = 0xd;
      local_2b8.field_2._M_local_buf[0xd] = '\0';
    }
    break;
  case 6:
    value = (field->field_20).default_value_float_;
    if (INFINITY <= value) goto LAB_001f32b0;
    if (value <= -INFINITY) goto LAB_001f33c4;
    if (NAN(value)) goto LAB_001f3502;
    local_1f8.slot_ = (slot_type *)&DAT_00000006;
    local_1f0.slot_ = (slot_type *)0x54d2b8;
    io::SimpleFtoa_abi_cxx11_(&local_298,this_01,value);
    local_2e8.piece_._M_len = local_298._M_string_length;
    local_2e8.piece_._M_str = local_298._M_dataplus._M_p;
    local_250.piece_._M_len = 1;
    local_250.piece_._M_str = ")";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_2b8,(lts_20250127 *)&local_1f8,&local_2e8,&local_250,pAVar15);
    goto LAB_001f3393;
  case 7:
    pcVar14 = "False";
    if ((ulong)(field->field_20).default_value_bool_ != 0) {
      pcVar14 = "True";
    }
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,pcVar14,
               pcVar14 + ((ulong)(field->field_20).default_value_bool_ ^ 5));
    break;
  case 8:
    pEVar11 = FieldDescriptor::default_value_enum(field);
    pcVar9 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (pEVar11->number_,(Nonnull<char_*>)local_1e8);
    local_1f8.slot_ = (slot_type *)(pcVar9 + -(long)local_1e8);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_1f0.slot_ = (slot_type *)local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,(slot_type *)local_1e8,pcVar9);
    break;
  case 9:
    local_1f8 = (anon_union_8_1_a8a14541_for_iterator_2)0x2;
    local_1f0.slot_ = (slot_type *)0x54d2bf;
    pEVar11 = (field->field_20).default_value_enum_;
    uVar2 = pEVar11->super_SymbolBaseN<0>;
    uVar5 = pEVar11->super_SymbolBaseN<1>;
    uVar6 = *(undefined2 *)&pEVar11->field_0x2;
    uVar7 = pEVar11->number_;
    src._M_len._4_4_ = uVar7;
    src._M_len._2_2_ = uVar6;
    src._M_len._1_1_ = uVar5;
    src._M_len._0_1_ = uVar2;
    src._M_str = (char *)&switchD_001f2e32::switchdataD_0054bae0;
    absl::lts_20250127::CEscape_abi_cxx11_(&local_298,(lts_20250127 *)pEVar11->all_names_,src);
    local_2e8.piece_._M_len = local_298._M_string_length;
    local_2e8.piece_._M_str = local_298._M_dataplus._M_p;
    bVar13 = field->type_ == '\t';
    local_250.piece_._M_str = "\"";
    if (bVar13) {
      local_250.piece_._M_str = "\".decode(\'utf-8\')";
    }
    local_250.piece_._M_len = (ulong)bVar13 * 0x10 + 1;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_2b8,(lts_20250127 *)&local_1f8,&local_2e8,&local_250,pAVar15);
LAB_001f3393:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    break;
  case 10:
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_2b8.field_2._M_allocated_capacity._0_2_ = 0x6f4e;
    local_2b8.field_2._M_local_buf[2] = 'n';
    local_2b8.field_2._M_local_buf[3] = 'e';
    local_2b8._M_string_length = 4;
    local_2b8.field_2._M_local_buf[4] = '\0';
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/generator.cc"
               ,0x9d);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_1f8,(char (*) [13])"Not reached.");
    goto LAB_001f34c6;
  }
LAB_001f2ce2:
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_1f8,&local_278,(char (*) [14])0x688ea7);
  std::__cxx11::string::operator=
            ((string *)
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)local_1f0.slot_ + 0x10))->_M_local_buf,(string *)&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT17(local_2b8.field_2._M_local_buf[7],
                             CONCAT25(local_2b8.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_2b8.field_2._M_local_buf[4],
                                               CONCAT13(local_2b8.field_2._M_local_buf[3],
                                                        CONCAT12(local_2b8.field_2._M_local_buf[2],
                                                                 local_2b8.field_2.
                                                                 _M_allocated_capacity._0_2_))))) +
                    1);
  }
  bVar1 = field->field_0x1;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[13]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_1f8,&local_278,(char (*) [13])0x6ffc2f);
  bVar13 = (bVar1 & 8) == 0;
  if (!bVar13) {
    pcVar16 = "True";
  }
  pAVar15 = (AlphaNum *)((ulong)bVar13 | 4);
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_1f0.slot_ + 0x10),0,*(char **)((long)local_1f0.slot_ + 0x18),
             (ulong)pcVar16);
  serialized_options._M_str = pcVar16;
  serialized_options._M_len = (size_t)local_220._M_dataplus._M_p;
  python::(anonymous_namespace)::OptionsValue_abi_cxx11_
            ((string *)&local_1f8,(_anonymous_namespace_ *)local_220._M_string_length,
             serialized_options);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[19]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_2e8,&local_278,(char (*) [19])"serialized_options");
  std::__cxx11::string::operator=
            ((string *)((long)local_2e8.piece_._M_str + 0x10),(string *)&local_1f8);
  if (local_1f8.slot_ != (slot_type *)local_1e8) {
    operator_delete(local_1f8.slot_,local_1e8[0]._M_allocated_capacity + 1);
  }
  if ((field->field_0x1 & 4) == 0) {
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
  }
  else {
    local_1f8.slot_ = (slot_type *)&DAT_0000000d;
    local_1f0.slot_ = (slot_type *)0x54d145;
    pcVar14 = (field->all_names_).payload_;
    local_2e8.piece_._M_len = (size_t)*(ushort *)(pcVar14 + 0xe);
    local_2e8.piece_._M_str = pcVar14 + -(ulong)*(ushort *)(pcVar14 + 0xc);
    local_250.piece_._M_len = 1;
    local_250.piece_._M_str = "\'";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_298,(lts_20250127 *)&local_1f8,&local_2e8,&local_250,pAVar15);
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[10]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_2b8,&local_278,(char (*) [10])0x688eda);
  std::__cxx11::string::operator=
            ((string *)(local_2b8._M_string_length + 0x10),(string *)&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  bVar13 = FieldDescriptor::is_required(field);
  if (bVar13) {
    pcVar9 = absl::lts_20250127::numbers_internal::FastIntToBuffer(2,(Nonnull<char_*>)local_1e8);
    local_1f8.slot_ = (slot_type *)(pcVar9 + -(long)local_1e8);
    local_2e8.piece_._M_len = (size_t)pcVar4;
    local_1f0.slot_ = (slot_type *)local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e8,(slot_type *)local_1e8,pcVar9);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[6]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_250,&local_278,(char (*) [6])"label");
  }
  else {
    bVar1 = field->field_0x1;
    bVar13 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 != bVar13) {
      pcVar12 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar13,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar12);
LAB_001f34c6:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_1f8);
    }
    if ((bVar1 & 0x20) == 0) {
      pcVar9 = absl::lts_20250127::numbers_internal::FastIntToBuffer(1,(Nonnull<char_*>)local_1e8);
      local_1f8.slot_ = (slot_type *)(pcVar9 + -(long)local_1e8);
      local_2e8.piece_._M_len = (size_t)pcVar4;
      local_1f0.slot_ = (slot_type *)local_1e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,(slot_type *)local_1e8,pcVar9);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[6]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_250,&local_278,(char (*) [6])"label");
    }
    else {
      pcVar9 = absl::lts_20250127::numbers_internal::FastIntToBuffer(3,(Nonnull<char_*>)local_1e8);
      local_1f8.slot_ = (slot_type *)(pcVar9 + -(long)local_1e8);
      local_2e8.piece_._M_len = (size_t)pcVar4;
      local_1f0.slot_ = (slot_type *)local_1e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,(slot_type *)local_1e8,pcVar9);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[6]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_250,&local_278,(char (*) [6])"label");
    }
  }
  std::__cxx11::string::operator=((string *)(local_250.piece_._M_str + 0x10),(string *)&local_2e8);
  if ((char *)local_2e8.piece_._M_len != pcVar4) {
    operator_delete((void *)local_2e8.piece_._M_len,local_2e8.digits_._0_8_ + 1);
  }
  memcpy(&local_1f8,
         "_descriptor.FieldDescriptor(\n  name=\'$name$\', full_name=\'$full_name$\', index=$index$,\n  number=$number$, type=$type$, cpp_type=$cpp_type$, label=$label$,\n  has_default_value=$has_default_value$, default_value=$default_value$,\n  message_type=None, enum_type=None, containing_type=None,\n  is_extension=$is_extension$, extension_scope=None,\n  serialized_options=$serialized_options$$json_name$, file=DESCRIPTOR,  create_key=_descriptor._internal_create_key)"
         ,0x1c7);
  this_00 = local_200->printer_;
  sVar10 = strlen((char *)&local_1f8);
  text._M_str = (char *)&local_1f8;
  text._M_len = sVar10;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (this_00,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_278,text);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set(&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,
                    CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                             local_220.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Generator::PrintFieldDescriptor(const FieldDescriptor& field,
                                     const FieldDescriptorProto& proto) const {
  std::string options_string;
  proto.options().SerializeToString(&options_string);
  absl::flat_hash_map<absl::string_view, std::string> m;
  m["name"] = std::string(field.name());
  m["full_name"] = std::string(field.full_name());
  m["index"] = absl::StrCat(field.index());
  m["number"] = absl::StrCat(field.number());
  m["type"] = absl::StrCat(field.type());
  m["cpp_type"] = absl::StrCat(field.cpp_type());
  m["has_default_value"] = field.has_default_value() ? "True" : "False";
  m["default_value"] = StringifyDefaultValue(field);
  m["is_extension"] = field.is_extension() ? "True" : "False";
  m["serialized_options"] = OptionsValue(options_string);
  m["json_name"] = field.has_json_name()
                       ? absl::StrCat(", json_name='", field.json_name(), "'")
                       : "";
  if (field.is_required()) {
    m["label"] = absl::StrCat(FieldDescriptor::Label::LABEL_REQUIRED);
  } else if (field.is_repeated()) {
    m["label"] = absl::StrCat(FieldDescriptor::Label::LABEL_REPEATED);
  } else {
    m["label"] = absl::StrCat(FieldDescriptor::Label::LABEL_OPTIONAL);
  }
  // We always set message_type and enum_type to None at this point, and then
  // these fields in correctly after all referenced descriptors have been
  // defined and/or imported (see FixForeignFieldsInDescriptors()).
  const char field_descriptor_decl[] =
      "_descriptor.FieldDescriptor(\n"
      "  name='$name$', full_name='$full_name$', index=$index$,\n"
      "  number=$number$, type=$type$, cpp_type=$cpp_type$, label=$label$,\n"
      "  has_default_value=$has_default_value$, "
      "default_value=$default_value$,\n"
      "  message_type=None, enum_type=None, containing_type=None,\n"
      "  is_extension=$is_extension$, extension_scope=None,\n"
      "  serialized_options=$serialized_options$$json_name$, file=DESCRIPTOR,"
      "  create_key=_descriptor._internal_create_key)";
  printer_->Print(m, field_descriptor_decl);
}